

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_primitives.c
# Opt level: O0

void al_draw_rounded_rectangle
               (float x1,float y1,float x2,float y2,float rx,float ry,ALLEGRO_COLOR color,
               float thickness)

{
  float in_XMM0_Da;
  float type;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  undefined4 in_XMM6_Da;
  undefined4 in_XMM6_Db;
  undefined8 in_XMM7_Qa;
  float in_stack_00000008;
  int ii_1;
  int num_segments_1;
  int ii;
  int num_segments;
  float scale;
  ALLEGRO_VERTEX vertex_cache [256];
  int local_243c;
  int local_2438;
  int local_2434;
  int local_2430;
  int in_stack_ffffffffffffdbd8;
  int in_stack_ffffffffffffdbdc;
  ALLEGRO_BITMAP *in_stack_ffffffffffffdbe0;
  undefined4 in_stack_ffffffffffffdbe8;
  int in_stack_ffffffffffffdbec;
  float in_stack_ffffffffffffdbf0;
  float in_stack_ffffffffffffdbf4;
  float in_stack_ffffffffffffdbf8;
  float in_stack_ffffffffffffdbfc;
  float in_stack_ffffffffffffdc00;
  float in_stack_ffffffffffffdc04;
  float in_stack_ffffffffffffdc08;
  int in_stack_ffffffffffffdc0c;
  float *in_stack_ffffffffffffdc10;
  float in_stack_ffffffffffffddb4;
  float in_stack_ffffffffffffddb8;
  float in_stack_ffffffffffffddbc;
  float in_stack_ffffffffffffddc0;
  float in_stack_ffffffffffffddc4;
  ALLEGRO_COLOR in_stack_ffffffffffffddc8;
  
  type = get_scale();
  if (in_stack_00000008 <= 0.0) {
    fVar1 = type * 10.0;
    fVar2 = sqrtf((in_XMM4_Da + in_XMM5_Da) / 2.0);
    local_2438 = (int)((fVar1 * fVar2) / 4.0);
    if (local_2438 < 2) {
      al_draw_rectangle(in_stack_ffffffffffffddc4,in_stack_ffffffffffffddc0,
                        in_stack_ffffffffffffddbc,in_stack_ffffffffffffddb8,
                        in_stack_ffffffffffffddc8,in_stack_ffffffffffffddb4);
    }
    else {
      if (0xff < local_2438 * 4) {
        local_2438 = 0x3f;
      }
      al_calculate_arc(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08
                       ,in_stack_ffffffffffffdc04,in_stack_ffffffffffffdc00,
                       in_stack_ffffffffffffdbfc,in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf4
                       ,in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbec);
      for (local_243c = 0; local_243c < local_2438; local_243c = local_243c + 1) {
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_243c + local_2438) * 0x24) =
             (in_XMM0_Da + in_XMM4_Da) -
             *(float *)(&stack0xffffffffffffdbd8 + (long)((local_2438 + -1) - local_243c) * 0x24);
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_243c + local_2438) * 0x24) =
             (in_XMM1_Da + in_XMM5_Da) -
             *(float *)(&stack0xffffffffffffdbdc + (long)((local_2438 + -1) - local_243c) * 0x24);
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_243c + local_2438 * 2) * 0x24) =
             (in_XMM0_Da + in_XMM4_Da) -
             *(float *)(&stack0xffffffffffffdbd8 + (long)local_243c * 0x24);
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_243c + local_2438 * 2) * 0x24) =
             (in_XMM3_Da - in_XMM5_Da) +
             *(float *)(&stack0xffffffffffffdbdc + (long)local_243c * 0x24);
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_243c + local_2438 * 3) * 0x24) =
             (in_XMM2_Da - in_XMM4_Da) +
             *(float *)(&stack0xffffffffffffdbd8 + (long)((local_2438 + -1) - local_243c) * 0x24);
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_243c + local_2438 * 3) * 0x24) =
             (in_XMM3_Da - in_XMM5_Da) +
             *(float *)(&stack0xffffffffffffdbdc + (long)((local_2438 + -1) - local_243c) * 0x24);
      }
      for (local_243c = 0; local_243c < local_2438; local_243c = local_243c + 1) {
        *(float *)(&stack0xffffffffffffdbd8 + (long)local_243c * 0x24) =
             (in_XMM2_Da - in_XMM4_Da) +
             *(float *)(&stack0xffffffffffffdbd8 + (long)local_243c * 0x24);
        *(float *)(&stack0xffffffffffffdbdc + (long)local_243c * 0x24) =
             (in_XMM1_Da + in_XMM5_Da) -
             *(float *)(&stack0xffffffffffffdbdc + (long)local_243c * 0x24);
      }
      for (local_243c = 0; local_243c < local_2438 * 4; local_243c = local_243c + 1) {
        *(ulong *)(&stack0xffffffffffffdbec + (long)local_243c * 0x24) =
             CONCAT44(in_XMM6_Db,in_XMM6_Da);
        *(undefined8 *)(&stack0xffffffffffffdbf4 + (long)local_243c * 0x24) = in_XMM7_Qa;
        *(undefined4 *)(&stack0xffffffffffffdbe0 + (long)local_243c * 0x24) = 0;
      }
      al_draw_prim((void *)CONCAT44(in_stack_ffffffffffffdbf4,in_stack_ffffffffffffdbf0),
                   (ALLEGRO_VERTEX_DECL *)
                   CONCAT44(in_stack_ffffffffffffdbec,in_stack_ffffffffffffdbe8),
                   in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8,
                   (int)type);
    }
  }
  else {
    fVar1 = type * 10.0;
    fVar2 = sqrtf((in_XMM4_Da + in_XMM5_Da) / 2.0);
    local_2430 = (int)((fVar1 * fVar2) / 4.0);
    if (local_2430 < 2) {
      al_draw_rectangle(in_stack_ffffffffffffddc4,in_stack_ffffffffffffddc0,
                        in_stack_ffffffffffffddbc,in_stack_ffffffffffffddb8,
                        in_stack_ffffffffffffddc8,in_stack_ffffffffffffddb4);
    }
    else {
      if (0xff < local_2430 * 8 + 2) {
        local_2430 = 0x1f;
      }
      al_calculate_arc(in_stack_ffffffffffffdc10,in_stack_ffffffffffffdc0c,in_stack_ffffffffffffdc08
                       ,in_stack_ffffffffffffdc04,in_stack_ffffffffffffdc00,
                       in_stack_ffffffffffffdbfc,in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf4
                       ,in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbec);
      for (local_2434 = 0; SBORROW4(local_2434,local_2430 * 2) != local_2434 + local_2430 * -2 < 0;
          local_2434 = local_2434 + 2) {
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_2434 + local_2430 * 2 + 1) * 0x24) =
             (in_XMM0_Da + in_XMM4_Da) -
             *(float *)(&stack0xffffffffffffdbd8 + (long)((local_2430 * 2 + -1) - local_2434) * 0x24
                       );
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_2434 + local_2430 * 2 + 1) * 0x24) =
             (in_XMM1_Da + in_XMM5_Da) -
             *(float *)(&stack0xffffffffffffdbdc + (long)((local_2430 * 2 + -1) - local_2434) * 0x24
                       );
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_2434 + local_2430 * 2) * 0x24) =
             (in_XMM0_Da + in_XMM4_Da) -
             *(float *)(&stack0xffffffffffffdbd8 + (long)((local_2430 * 2 - local_2434) + -2) * 0x24
                       );
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_2434 + local_2430 * 2) * 0x24) =
             (in_XMM1_Da + in_XMM5_Da) -
             *(float *)(&stack0xffffffffffffdbdc + (long)((local_2430 * 2 - local_2434) + -2) * 0x24
                       );
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_2434 + local_2430 * 4) * 0x24) =
             (in_XMM0_Da + in_XMM4_Da) -
             *(float *)(&stack0xffffffffffffdbd8 + (long)local_2434 * 0x24);
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_2434 + local_2430 * 4) * 0x24) =
             (in_XMM3_Da - in_XMM5_Da) +
             *(float *)(&stack0xffffffffffffdbdc + (long)local_2434 * 0x24);
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_2434 + local_2430 * 4 + 1) * 0x24) =
             (in_XMM0_Da + in_XMM4_Da) -
             *(float *)(&stack0xffffffffffffdbd8 + (long)(local_2434 + 1) * 0x24);
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_2434 + local_2430 * 4 + 1) * 0x24) =
             (in_XMM3_Da - in_XMM5_Da) +
             *(float *)(&stack0xffffffffffffdbdc + (long)(local_2434 + 1) * 0x24);
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_2434 + local_2430 * 6 + 1) * 0x24) =
             (in_XMM2_Da - in_XMM4_Da) +
             *(float *)(&stack0xffffffffffffdbd8 + (long)((local_2430 * 2 + -1) - local_2434) * 0x24
                       );
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_2434 + local_2430 * 6 + 1) * 0x24) =
             (in_XMM3_Da - in_XMM5_Da) +
             *(float *)(&stack0xffffffffffffdbdc + (long)((local_2430 * 2 + -1) - local_2434) * 0x24
                       );
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_2434 + local_2430 * 6) * 0x24) =
             (in_XMM2_Da - in_XMM4_Da) +
             *(float *)(&stack0xffffffffffffdbd8 + (long)((local_2430 * 2 - local_2434) + -2) * 0x24
                       );
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_2434 + local_2430 * 6) * 0x24) =
             (in_XMM3_Da - in_XMM5_Da) +
             *(float *)(&stack0xffffffffffffdbdc + (long)((local_2430 * 2 - local_2434) + -2) * 0x24
                       );
      }
      for (local_2434 = 0; SBORROW4(local_2434,local_2430 * 2) != local_2434 + local_2430 * -2 < 0;
          local_2434 = local_2434 + 2) {
        *(float *)(&stack0xffffffffffffdbd8 + (long)local_2434 * 0x24) =
             (in_XMM2_Da - in_XMM4_Da) +
             *(float *)(&stack0xffffffffffffdbd8 + (long)local_2434 * 0x24);
        *(float *)(&stack0xffffffffffffdbdc + (long)local_2434 * 0x24) =
             (in_XMM1_Da + in_XMM5_Da) -
             *(float *)(&stack0xffffffffffffdbdc + (long)local_2434 * 0x24);
        *(float *)(&stack0xffffffffffffdbd8 + (long)(local_2434 + 1) * 0x24) =
             (in_XMM2_Da - in_XMM4_Da) +
             *(float *)(&stack0xffffffffffffdbd8 + (long)(local_2434 + 1) * 0x24);
        *(float *)(&stack0xffffffffffffdbdc + (long)(local_2434 + 1) * 0x24) =
             (in_XMM1_Da + in_XMM5_Da) -
             *(float *)(&stack0xffffffffffffdbdc + (long)(local_2434 + 1) * 0x24);
      }
      memcpy(&stack0xffffffffffffdbd8 + (long)(local_2430 << 3) * 0x24,&stack0xffffffffffffdbd8,0x24
            );
      memcpy(&stack0xffffffffffffdbd8 + (long)(local_2430 * 8 + 1) * 0x24,&stack0xffffffffffffdbfc,
             0x24);
      for (local_2434 = 0; local_2434 < local_2430 * 8 + 2; local_2434 = local_2434 + 1) {
        *(ulong *)(&stack0xffffffffffffdbec + (long)local_2434 * 0x24) =
             CONCAT44(in_XMM6_Db,in_XMM6_Da);
        *(undefined8 *)(&stack0xffffffffffffdbf4 + (long)local_2434 * 0x24) = in_XMM7_Qa;
        *(undefined4 *)(&stack0xffffffffffffdbe0 + (long)local_2434 * 0x24) = 0;
      }
      al_draw_prim((void *)CONCAT44(in_stack_ffffffffffffdbf4,in_stack_ffffffffffffdbf0),
                   (ALLEGRO_VERTEX_DECL *)
                   CONCAT44(in_stack_ffffffffffffdbec,in_stack_ffffffffffffdbe8),
                   in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8,
                   (int)type);
    }
  }
  return;
}

Assistant:

void al_draw_rounded_rectangle(float x1, float y1, float x2, float y2,
   float rx, float ry, ALLEGRO_COLOR color, float thickness)
{
   LOCAL_VERTEX_CACHE;
   float scale = get_scale();

   ASSERT(rx >= 0);
   ASSERT(ry >= 0);

   if (thickness > 0) {
      int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;
      int ii;

      /* In case rx and ry are both 0. */
      if (num_segments < 2) {
         al_draw_rectangle(x1, y1, x2, y2, color, thickness);
         return;
      }

      if (8 * num_segments + 2 >= ALLEGRO_VERTEX_CACHE_SIZE) {
         num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 3) / 8;
      }
      
      al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, thickness, num_segments);
      
      for (ii = 0; ii < 2 * num_segments; ii += 2) {
         vertex_cache[ii + 2 * num_segments + 1].x = x1 + rx - vertex_cache[2 * num_segments - 1 - ii].x;
         vertex_cache[ii + 2 * num_segments + 1].y = y1 + ry - vertex_cache[2 * num_segments - 1 - ii].y;
         vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[2 * num_segments - 1 - ii - 1].x;
         vertex_cache[ii + 2 * num_segments].y = y1 + ry - vertex_cache[2 * num_segments - 1 - ii - 1].y;

         vertex_cache[ii + 4 * num_segments].x = x1 + rx - vertex_cache[ii].x;
         vertex_cache[ii + 4 * num_segments].y = y2 - ry + vertex_cache[ii].y;
         vertex_cache[ii + 4 * num_segments + 1].x = x1 + rx - vertex_cache[ii + 1].x;
         vertex_cache[ii + 4 * num_segments + 1].y = y2 - ry + vertex_cache[ii + 1].y;

         vertex_cache[ii + 6 * num_segments + 1].x = x2 - rx + vertex_cache[2 * num_segments - 1 - ii].x;
         vertex_cache[ii + 6 * num_segments + 1].y = y2 - ry + vertex_cache[2 * num_segments - 1 - ii].y;
         vertex_cache[ii + 6 * num_segments].x = x2 - rx + vertex_cache[2 * num_segments - 1 - ii - 1].x;
         vertex_cache[ii + 6 * num_segments].y = y2 - ry + vertex_cache[2 * num_segments - 1 - ii - 1].y;
      }
      for (ii = 0; ii < 2 * num_segments; ii += 2) {
         vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
         vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
         vertex_cache[ii + 1].x = x2 - rx + vertex_cache[ii + 1].x;
         vertex_cache[ii + 1].y = y1 + ry - vertex_cache[ii + 1].y;
      }
      vertex_cache[8 * num_segments] = vertex_cache[0];
      vertex_cache[8 * num_segments + 1] = vertex_cache[1];

      for (ii = 0; ii < 8 * num_segments + 2; ii++) {
         vertex_cache[ii].color = color;
         vertex_cache[ii].z = 0;
      }
         
      al_draw_prim(vertex_cache, 0, 0, 0, 8 * num_segments + 2, ALLEGRO_PRIM_TRIANGLE_STRIP);
   } else {
      int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;
      int ii;
      
      /* In case rx and ry are both 0. */
      if (num_segments < 2) {
         al_draw_rectangle(x1, y1, x2, y2, color, thickness);
         return;
      }

      if (num_segments * 4 >= ALLEGRO_VERTEX_CACHE_SIZE) {
         num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 1) / 4;
      }
      
      al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, 0, num_segments + 1);

      for (ii = 0; ii < num_segments; ii++) {
         vertex_cache[ii + 1 * num_segments].x = x1 + rx - vertex_cache[num_segments - 1 - ii].x;
         vertex_cache[ii + 1 * num_segments].y = y1 + ry - vertex_cache[num_segments - 1 - ii].y;

         vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[ii].x;
         vertex_cache[ii + 2 * num_segments].y = y2 - ry + vertex_cache[ii].y;

         vertex_cache[ii + 3 * num_segments].x = x2 - rx + vertex_cache[num_segments - 1 - ii].x;
         vertex_cache[ii + 3 * num_segments].y = y2 - ry + vertex_cache[num_segments - 1 - ii].y;
      }
      for (ii = 0; ii < num_segments; ii++) {
         vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
         vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
      }

      for (ii = 0; ii < 4 * num_segments; ii++) {
         vertex_cache[ii].color = color;
         vertex_cache[ii].z = 0;
      }
         
      al_draw_prim(vertex_cache, 0, 0, 0, 4 * num_segments, ALLEGRO_PRIM_LINE_LOOP);
   }
}